

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

ssh_keyalg * pubkey_blob_to_alg(ptrlen blob)

{
  ssh_keyalg *psVar1;
  ptrlen name;
  
  name = pubkey_blob_to_alg_name(blob);
  psVar1 = find_pubkey_alg_len(name);
  return psVar1;
}

Assistant:

const ssh_keyalg *pubkey_blob_to_alg(ptrlen blob)
{
    return find_pubkey_alg_len(pubkey_blob_to_alg_name(blob));
}